

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

ObjList * new_list(Vm *vm,size_t size)

{
  ObjList *pOVar1;
  uint64_t uVar2;
  CrispyValue *pCVar3;
  
  pOVar1 = (ObjList *)allocate_object(vm,0x28,OBJ_LIST);
  uVar2 = next_pow_of_2(size & 0xffffffff);
  pCVar3 = (CrispyValue *)reallocate((void *)0x0,uVar2 << 4);
  (pOVar1->content).cap = uVar2;
  (pOVar1->content).count = size & 0xffffffff;
  (pOVar1->content).values = pCVar3;
  return pOVar1;
}

Assistant:

ObjList *new_list(Vm *vm, size_t size) {
    ObjList *list = ALLOC_OBJ(vm, ObjList, OBJ_LIST);
    ValueArray val_arr;
    val_arr_init(&val_arr);

    val_arr.count = (uint32_t) size;
    val_arr.cap = next_pow_of_2(val_arr.count);
    val_arr.values = GROW_ARR(val_arr.values, CrispyValue, val_arr.cap);

    list->content = val_arr;

    return list;
}